

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O1

Vec_Int_t * Bmc_ChainFindFailedOutputs(Gia_Man_t *p,Vec_Ptr_t *vCexes)

{
  uint uVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  Vec_Int_t *vSatIds;
  int *piVar3;
  sat_solver *s;
  Vec_Int_t *p_01;
  Vec_Int_t *pVVar4;
  Abc_Cex_t *pAVar5;
  void **ppvVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  size_t __size;
  long lVar11;
  int Lit;
  int local_4c;
  Vec_Ptr_t *local_48;
  long local_40;
  Vec_Int_t *local_38;
  
  local_48 = vCexes;
  p_00 = Gia_ManDupPosAndPropagateInit(p);
  iVar10 = p->vCis->nSize - p->nRegs;
  vSatIds = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar7 = iVar10;
  }
  vSatIds->nSize = 0;
  vSatIds->nCap = iVar7;
  if (iVar7 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar7 << 2);
  }
  vSatIds->pArray = piVar3;
  s = Gia_ManDeriveSatSolver(p_00,vSatIds);
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_01->pArray = piVar3;
  pVVar4 = p_00->vCos;
  uVar8 = (ulong)(uint)pVVar4->nSize;
  if (p_00->nRegs < pVVar4->nSize) {
    lVar11 = 0;
    local_38 = p_01;
    do {
      if ((int)uVar8 <= lVar11) {
LAB_00526dd0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = pVVar4->pArray[lVar11];
      if (((long)iVar7 < 0) || (p_00->nObjs <= iVar7)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p_00->pObjs == (Gia_Obj_t *)0x0) break;
      uVar1 = *(uint *)(p_00->pObjs + iVar7);
      uVar2 = iVar7 - (uVar1 & 0x1fffffff);
      if ((int)uVar2 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf1,"int Abc_Var2Lit(int, int)");
      }
      if ((uVar2 & 0x7fffffff) != 0 || (uVar1 >> 0x1d & 1) != 0) {
        iVar7 = (int)lVar11;
        local_4c = iVar7 * 2 + 2;
        iVar10 = sat_solver_solve(s,&local_4c,(lit *)&local_48,0,0,0,0);
        if (iVar10 == 1) {
          Vec_IntPush(p_01,iVar7);
          if (local_48 != (Vec_Ptr_t *)0x0) {
            pAVar5 = Abc_CexAlloc(p->nRegs,p->vCis->nSize - p->nRegs,1);
            pAVar5->iFrame = 0;
            pAVar5->iPo = iVar7;
            pVVar4 = p->vCis;
            uVar8 = (ulong)(uint)p->nRegs;
            if (p->nRegs < pVVar4->nSize) {
              lVar9 = 0;
              do {
                if (vSatIds->nSize <= lVar9) goto LAB_00526dd0;
                iVar7 = vSatIds->pArray[lVar9];
                if (((long)iVar7 < 0) || (s->size <= iVar7)) {
                  __assert_fail("v >= 0 && v < s->size",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                                ,0xd0,"int sat_solver_var_value(sat_solver *, int)");
                }
                if (s->model[iVar7] == 1) {
                  iVar7 = (int)uVar8 + (int)lVar9;
                  (&pAVar5[1].iPo)[iVar7 >> 5] =
                       (&pAVar5[1].iPo)[iVar7 >> 5] | 1 << ((byte)iVar7 & 0x1f);
                }
                lVar9 = lVar9 + 1;
                uVar8 = (ulong)p->nRegs;
              } while (lVar9 < (long)((long)pVVar4->nSize - uVar8));
            }
            uVar1 = local_48->nCap;
            if (local_48->nSize == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (local_48->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(local_48->pArray,0x80);
                }
                local_48->pArray = ppvVar6;
                iVar7 = 0x10;
              }
              else {
                lVar9 = (ulong)uVar1 * 2;
                if ((int)lVar9 <= (int)uVar1) goto LAB_00526d3a;
                __size = (ulong)uVar1 << 4;
                local_40 = lVar9;
                if (local_48->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(__size);
                }
                else {
                  ppvVar6 = (void **)realloc(local_48->pArray,__size);
                }
                local_48->pArray = ppvVar6;
                iVar7 = (int)local_40;
              }
              local_48->nCap = iVar7;
            }
LAB_00526d3a:
            iVar7 = local_48->nSize;
            local_48->nSize = iVar7 + 1;
            local_48->pArray[iVar7] = pAVar5;
            p_01 = local_38;
          }
        }
      }
      lVar11 = lVar11 + 1;
      pVVar4 = p_00->vCos;
      uVar8 = (ulong)pVVar4->nSize;
    } while (lVar11 < (long)(uVar8 - (long)p_00->nRegs));
  }
  Gia_ManStop(p_00);
  sat_solver_delete(s);
  if (vSatIds->pArray != (int *)0x0) {
    free(vSatIds->pArray);
    vSatIds->pArray = (int *)0x0;
  }
  free(vSatIds);
  return p_01;
}

Assistant:

Vec_Int_t * Bmc_ChainFindFailedOutputs( Gia_Man_t * p, Vec_Ptr_t * vCexes )
{
    Vec_Int_t * vOutputs;
    Vec_Int_t * vSatIds;
    Gia_Man_t * pInit;
    Gia_Obj_t * pObj;
    sat_solver * pSat;
    int i, j, Lit, status = 0;
    // derive output logic cones
    pInit = Gia_ManDupPosAndPropagateInit( p );
    // derive SAT solver and test
    vSatIds = Vec_IntAlloc( Gia_ManPiNum(p) );
    pSat = Gia_ManDeriveSatSolver( pInit, vSatIds );
    vOutputs = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( pInit, pObj, i )
    {
        if ( Gia_ObjFaninLit0p(pInit, pObj) == 0 )
            continue;
        Lit = Abc_Var2Lit( i+1, 0 );
        status = sat_solver_solve( pSat, &Lit, &Lit + 1, 0, 0, 0, 0 );
        if ( status == l_True )
        {
            // save the index of solved output
            Vec_IntPush( vOutputs, i );
            // create CEX for this output
            if ( vCexes )
            {
                Abc_Cex_t * pCex = Abc_CexAlloc( Gia_ManRegNum(p), Gia_ManPiNum(p), 1 );
                pCex->iFrame = 0;
                pCex->iPo = i;
                for ( j = 0; j < Gia_ManPiNum(p); j++ )
                    if ( sat_solver_var_value( pSat, Vec_IntEntry(vSatIds, j) ) )
                        Abc_InfoSetBit( pCex->pData, Gia_ManRegNum(p) + j );
                Vec_PtrPush( vCexes, pCex );
            }
        }
    }
    Gia_ManStop( pInit );
    sat_solver_delete( pSat );
    Vec_IntFree( vSatIds );
    return vOutputs;
}